

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ecdh(secp256k1_context *ctx,uchar *output,secp256k1_pubkey *point,uchar *scalar,
                  secp256k1_ecdh_hash_function hashfp,void *data)

{
  undefined4 extraout_EAX;
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  code *pcVar4;
  undefined1 auVar5 [16];
  int overflow;
  secp256k1_ge pt;
  uchar y [32];
  uchar x [32];
  secp256k1_scalar s;
  secp256k1_gej res;
  uint local_18c;
  uchar *local_188;
  void *local_180;
  secp256k1_ge local_178;
  uchar local_118 [32];
  uchar local_f8 [32];
  secp256k1_scalar local_d8;
  secp256k1_gej local_b8;
  
  local_18c = 0;
  if (output == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "output != NULL";
  }
  else if (point == (secp256k1_pubkey *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "point != NULL";
  }
  else {
    if (scalar != (uchar *)0x0) {
      pcVar4 = ecdh_hash_function_sha256;
      if (hashfp != (secp256k1_ecdh_hash_function)0x0) {
        pcVar4 = hashfp;
      }
      local_188 = output;
      local_180 = data;
      secp256k1_pubkey_load(ctx,&local_178,point);
      secp256k1_scalar_set_b32(&local_d8,scalar,(int *)&local_18c);
      auVar5._0_4_ = -(uint)((int)local_d8.d[0] == 0 && (int)local_d8.d[2] == 0);
      auVar5._4_4_ = -(uint)(local_d8.d[0]._4_4_ == 0 && local_d8.d[2]._4_4_ == 0);
      auVar5._8_4_ = -(uint)((int)local_d8.d[1] == 0 && (int)local_d8.d[3] == 0);
      auVar5._12_4_ = -(uint)(local_d8.d[1]._4_4_ == 0 && local_d8.d[3]._4_4_ == 0);
      iVar1 = movmskps(extraout_EAX,auVar5);
      local_18c = iVar1 == 0xf | local_18c;
      secp256k1_scalar_cmov(&local_d8,&secp256k1_scalar_one,local_18c);
      secp256k1_ecmult_const(&local_b8,&local_178,&local_d8);
      secp256k1_ge_set_gej(&local_178,&local_b8);
      secp256k1_fe_impl_normalize(&local_178.x);
      secp256k1_fe_impl_normalize(&local_178.y);
      secp256k1_fe_impl_get_b32(local_f8,&local_178.x);
      secp256k1_fe_impl_get_b32(local_118,&local_178.y);
      iVar1 = (*pcVar4)(local_188,local_f8,local_118,local_180);
      return (uint)(local_18c == 0 && iVar1 != 0);
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "scalar != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_ecdh(const secp256k1_context* ctx, unsigned char *output, const secp256k1_pubkey *point, const unsigned char *scalar, secp256k1_ecdh_hash_function hashfp, void *data) {
    int ret = 0;
    int overflow = 0;
    secp256k1_gej res;
    secp256k1_ge pt;
    secp256k1_scalar s;
    unsigned char x[32];
    unsigned char y[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(point != NULL);
    ARG_CHECK(scalar != NULL);

    if (hashfp == NULL) {
        hashfp = secp256k1_ecdh_hash_function_default;
    }

    secp256k1_pubkey_load(ctx, &pt, point);
    secp256k1_scalar_set_b32(&s, scalar, &overflow);

    overflow |= secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_one, overflow);

    secp256k1_ecmult_const(&res, &pt, &s);
    secp256k1_ge_set_gej(&pt, &res);

    /* Compute a hash of the point */
    secp256k1_fe_normalize(&pt.x);
    secp256k1_fe_normalize(&pt.y);
    secp256k1_fe_get_b32(x, &pt.x);
    secp256k1_fe_get_b32(y, &pt.y);

    ret = hashfp(output, x, y, data);

    secp256k1_memclear(x, sizeof(x));
    secp256k1_memclear(y, sizeof(y));
    secp256k1_scalar_clear(&s);
    secp256k1_ge_clear(&pt);
    secp256k1_gej_clear(&res);

    return !!ret & !overflow;
}